

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O0

void __thiscall Js::ScriptContextProfiler::ProfilePrint(ScriptContextProfiler *this)

{
  bool bVar1;
  Phase PVar2;
  byte local_29;
  ScriptContextProfiler *local_20;
  ScriptContextProfiler *mergeToProfiler;
  ScriptContextProfiler *profiler;
  ScriptContextProfiler *this_local;
  
  local_20 = this;
  mergeToProfiler = this;
  if ((DAT_01ec73ca & 1) == 0) {
    while( true ) {
      local_29 = 0;
      if (local_20 != (ScriptContextProfiler *)0x0) {
        bVar1 = IsInitialized(local_20);
        local_29 = bVar1 ^ 0xff;
      }
      if ((local_29 & 1) == 0) break;
      local_20 = local_20->next;
    }
    if (local_20 != (ScriptContextProfiler *)0x0) {
      for (mergeToProfiler = local_20->next; mergeToProfiler != (ScriptContextProfiler *)0x0;
          mergeToProfiler = mergeToProfiler->next) {
        bVar1 = IsInitialized(mergeToProfiler);
        if (bVar1) {
          ProfileMerge(local_20,mergeToProfiler);
        }
      }
      PVar2 = Phases::GetFirstPhase((Phases *)&DAT_01eb89f0);
      ProfilePrint(local_20,PVar2);
    }
  }
  else {
    for (; mergeToProfiler != (ScriptContextProfiler *)0x0; mergeToProfiler = mergeToProfiler->next)
    {
      PVar2 = Phases::GetFirstPhase((Phases *)&DAT_01eb89f0);
      ProfilePrint(mergeToProfiler,PVar2);
    }
  }
  return;
}

Assistant:

void
    ScriptContextProfiler::ProfilePrint()
    {
        Js::ScriptContextProfiler* profiler = this;
        if (Js::Configuration::Global.flags.Verbose)
        {
            //Print individual profiler information in verbose mode
            while (profiler)
            {
                profiler->ProfilePrint(Js::Configuration::Global.flags.Profile.GetFirstPhase());
                profiler = profiler->next;
            }
        }
        else
        {
            //Merge all the profiler for single snapshot.
            Js::ScriptContextProfiler* mergeToProfiler = profiler;

            // find the first initialized profiler
            while (mergeToProfiler != nullptr && !mergeToProfiler->IsInitialized())
            {
                mergeToProfiler = mergeToProfiler->next;
            }
            if (mergeToProfiler != nullptr)
            {
                // merge the rest profiler to the above initialized profiler
                profiler = mergeToProfiler->next;
                while (profiler)
                {
                    if (profiler->IsInitialized())
                    {
                        mergeToProfiler->ProfileMerge(profiler);
                    }
                    profiler = profiler->next;
                }
                mergeToProfiler->ProfilePrint(Js::Configuration::Global.flags.Profile.GetFirstPhase());
            }
        }
    }